

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

void __thiscall
cmCacheManager::WritePropertyEntries(cmCacheManager *this,ostream *os,CacheIterator *i)

{
  char *pcVar1;
  char **ppcVar2;
  string key;
  string helpstring;
  allocator local_99;
  CacheIterator *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_98 = i;
  for (ppcVar2 = PersistentProperties; *ppcVar2 != (char *)0x0; ppcVar2 = ppcVar2 + 1) {
    std::__cxx11::string::string((string *)&local_70,*ppcVar2,(allocator *)&local_90);
    pcVar1 = CacheIterator::GetProperty(local_98,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (pcVar1 != (char *)0x0) {
      std::__cxx11::string::string((string *)&local_70,*ppcVar2,(allocator *)&local_90);
      std::__cxx11::string::append((char *)&local_70);
      CacheIterator::GetName_abi_cxx11_(&local_90,local_98);
      std::__cxx11::string::append((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      OutputHelpString(os,&local_70);
      CacheIterator::GetName_abi_cxx11_(&local_90,local_98);
      std::__cxx11::string::append((char *)&local_90);
      std::__cxx11::string::append((char *)&local_90);
      OutputKey(os,&local_90);
      std::operator<<(os,":INTERNAL=");
      std::__cxx11::string::string((string *)&local_50,pcVar1,&local_99);
      OutputValue(os,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::operator<<(os,"\n");
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  return;
}

Assistant:

void cmCacheManager::WritePropertyEntries(std::ostream& os,
                                          CacheIterator const& i)
{
  for(const char** p = this->PersistentProperties; *p; ++p)
    {
    if(const char* value = i.GetProperty(*p))
      {
      std::string helpstring = *p;
      helpstring += " property for variable: ";
      helpstring += i.GetName();
      cmCacheManager::OutputHelpString(os, helpstring);

      std::string key = i.GetName();
      key += "-";
      key += *p;
      this->OutputKey(os, key);
      os << ":INTERNAL=";
      this->OutputValue(os, value);
      os << "\n";
      }
    }
}